

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

uchar * do_png(png *p,int *x,int *y,int *n,int req_comp)

{
  int iVar1;
  uchar *data;
  
  p->idata = (uint8 *)0x0;
  p->expanded = (uint8 *)0x0;
  p->out = (uint8 *)0x0;
  if ((uint)req_comp < 5) {
    data = (uchar *)0x0;
    iVar1 = parse_png_file(p,0,req_comp);
    if (iVar1 != 0) {
      data = p->out;
      p->out = (uint8 *)0x0;
      if ((req_comp != 0) && (iVar1 = (p->s).img_out_n, iVar1 != req_comp)) {
        data = convert_format(data,iVar1,req_comp,(p->s).img_x,(p->s).img_y);
        (p->s).img_out_n = req_comp;
        if (data == (uchar *)0x0) goto LAB_0014a743;
      }
      *x = (p->s).img_x;
      *y = (p->s).img_y;
      if (n != (int *)0x0) {
        *n = (p->s).img_n;
      }
    }
    free(p->out);
    p->out = (uint8 *)0x0;
    free(p->expanded);
    p->expanded = (uint8 *)0x0;
    free(p->idata);
    p->idata = (uint8 *)0x0;
  }
  else {
    failure_reason = "Internal error";
LAB_0014a743:
    data = (uchar *)0x0;
  }
  return data;
}

Assistant:

static unsigned char *do_png(png *p, int *x, int *y, int *n, int req_comp)
{
   unsigned char *result=NULL;
   p->expanded = NULL;
   p->idata = NULL;
   p->out = NULL;
   if (req_comp < 0 || req_comp > 4) return epuc("bad req_comp", "Internal error");
   if (parse_png_file(p, SCAN_load, req_comp)) {
      result = p->out;
      p->out = NULL;
      if (req_comp && req_comp != p->s.img_out_n) {
         result = convert_format(result, p->s.img_out_n, req_comp, p->s.img_x, p->s.img_y);
         p->s.img_out_n = req_comp;
         if (result == NULL) return result;
      }
      *x = p->s.img_x;
      *y = p->s.img_y;
      if (n) *n = p->s.img_n;
   }
   free(p->out);      p->out      = NULL;
   free(p->expanded); p->expanded = NULL;
   free(p->idata);    p->idata    = NULL;

   return result;
}